

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# icrs2obs.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  double date_00;
  CESkyCoord obs_coords;
  CESkyCoord obs_icrs_coords;
  CEDate date;
  CESkyCoord icrs_coords;
  CEObserver observer;
  CEExecOptions opts;
  allocator local_40f;
  allocator local_40e;
  allocator local_40d;
  CEAngleType local_40c;
  CESkyCoord local_408;
  string local_3d8;
  double local_3b8;
  double local_3b0;
  double local_3a8;
  CESkyCoord local_3a0;
  CEDate local_370;
  CESkyCoord local_330;
  CEObserver local_300;
  CEExecOptions local_250;
  
  DefineOpts();
  bVar1 = CLOptions::ParseCommandLine(&local_250.super_CLOptions,argc,argv);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_300,"ra",(allocator *)&local_3b8);
    local_3d8._M_dataplus._M_p =
         (pointer)CLOptions::AsDouble(&local_250.super_CLOptions,(string *)&local_300);
    CEAngle::Deg((CEAngle *)&local_408,(double *)&local_3d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_370,"dec",(allocator *)&local_40c);
    local_3a8 = CLOptions::AsDouble(&local_250.super_CLOptions,(string *)&local_370);
    CEAngle::Deg((CEAngle *)&local_3a0,&local_3a8);
    local_3b0 = (double)CONCAT44(local_3b0._4_4_,1);
    CESkyCoord::CESkyCoord
              (&local_330,(CEAngle *)&local_408,(CEAngle *)&local_3a0,(CESkyCoordType *)&local_3b0);
    CEAngle::~CEAngle((CEAngle *)&local_3a0);
    std::__cxx11::string::~string((string *)&local_370);
    __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_40c);
    CEAngle::~CEAngle((CEAngle *)&local_408);
    std::__cxx11::string::~string((string *)&local_300);
    __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_3b8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_300,"juliandate",(allocator *)&local_408);
    date_00 = CLOptions::AsDouble(&local_250.super_CLOptions,(string *)&local_300);
    CEDate::CEDate(&local_370,date_00,JD);
    std::__cxx11::string::~string((string *)&local_300);
    __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_408);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_408,"longitude",&local_40d);
    local_3a8 = CLOptions::AsDouble(&local_250.super_CLOptions,(string *)&local_408);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3a0,"latitude",&local_40e);
    local_3b0 = CLOptions::AsDouble(&local_250.super_CLOptions,(string *)&local_3a0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3d8,"elevation",&local_40f);
    local_3b8 = CLOptions::AsDouble(&local_250.super_CLOptions,&local_3d8);
    local_40c = DEGREES;
    CEObserver::CEObserver(&local_300,&local_3a8,&local_3b0,&local_3b8,&local_40c);
    std::__cxx11::string::~string((string *)&local_3d8);
    __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_40f);
    std::__cxx11::string::~string((string *)&local_3a0);
    __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_40e);
    std::__cxx11::string::~string((string *)&local_408);
    __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_40d);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_408,"pressure",(allocator *)&local_3d8);
    local_3a0._vptr_CESkyCoord =
         (_func_int **)CLOptions::AsDouble(&local_250.super_CLOptions,(string *)&local_408);
    CEObserver::SetPressure_hPa(&local_300,(double *)&local_3a0);
    std::__cxx11::string::~string((string *)&local_408);
    __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_3d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_408,"temperature",(allocator *)&local_3d8);
    local_3a0._vptr_CESkyCoord =
         (_func_int **)CLOptions::AsDouble(&local_250.super_CLOptions,(string *)&local_408);
    CEObserver::SetTemperature_C(&local_300,(double *)&local_3a0);
    std::__cxx11::string::~string((string *)&local_408);
    __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_3d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_408,"humidity",(allocator *)&local_3d8);
    local_3a0._vptr_CESkyCoord =
         (_func_int **)CLOptions::AsDouble(&local_250.super_CLOptions,(string *)&local_408);
    CEObserver::SetRelativeHumidity(&local_300,(double *)&local_3a0);
    std::__cxx11::string::~string((string *)&local_408);
    __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_3d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_408,"wavelength",(allocator *)&local_3d8);
    local_3a0._vptr_CESkyCoord =
         (_func_int **)CLOptions::AsDouble(&local_250.super_CLOptions,(string *)&local_408);
    CEObserver::SetWavelength_um(&local_300,(double *)&local_3a0);
    std::__cxx11::string::~string((string *)&local_408);
    __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_3d8);
    CESkyCoord::CESkyCoord(&local_408);
    CESkyCoord::CESkyCoord(&local_3a0);
    CESkyCoord::ICRS2Observed(&local_330,&local_408,&local_370,&local_300,&local_3a0,(CEAngle *)0x0)
    ;
    PrintResults(&local_330,&local_408,&local_3a0,&local_300,&local_370);
    CESkyCoord::~CESkyCoord(&local_3a0);
    CESkyCoord::~CESkyCoord(&local_408);
    CEObserver::~CEObserver(&local_300);
    CEDate::~CEDate(&local_370);
    CESkyCoord::~CESkyCoord(&local_330);
  }
  CEExecOptions::~CEExecOptions(&local_250);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{    
    CEExecOptions opts = DefineOpts();
    if (opts.ParseCommandLine(argc, argv)) return 0;
    
    // Create the input and output coordinates
    CESkyCoord icrs_coords(CEAngle::Deg(opts.AsDouble("ra")), 
                           CEAngle::Deg(opts.AsDouble("dec")),
                           CESkyCoordType::ICRS);
    
    // Define the date
    CEDate date(opts.AsDouble("juliandate"), CEDateType::JD);

    // Define the observer
    CEObserver observer(opts.AsDouble("longitude"),
                        opts.AsDouble("latitude"),
                        opts.AsDouble("elevation"),
                        CEAngleType::DEGREES);
    observer.SetPressure_hPa(opts.AsDouble("pressure"));
    observer.SetTemperature_C(opts.AsDouble("temperature"));
    observer.SetRelativeHumidity(opts.AsDouble("humidity"));
    observer.SetWavelength_um(opts.AsDouble("wavelength"));

    // Convert the coordinates
    CESkyCoord obs_coords;
    CESkyCoord obs_icrs_coords;
    CESkyCoord::ICRS2Observed(icrs_coords, &obs_coords, date, observer, &obs_icrs_coords);
    
    // Print the results
    PrintResults(icrs_coords, obs_coords, obs_icrs_coords, observer, date);
    
    return 0 ;
}